

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O0

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>
duckdb::CopyInfo::Deserialize(Deserializer *deserializer)

{
  pointer pCVar1;
  Deserializer *this;
  pointer pCVar2;
  Deserializer *this_00;
  Deserializer *in_RSI;
  unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_> in_RDI;
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> result;
  pointer in_stack_ffffffffffffff28;
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
  *in_stack_ffffffffffffff30;
  bool *in_stack_ffffffffffffff38;
  Deserializer *pDVar3;
  char *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  field_id_t fVar4;
  Deserializer *in_stack_ffffffffffffff50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_ffffffffffffff58;
  CopyInfo *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  Deserializer *ret;
  Deserializer *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  field_id_t fVar5;
  field_id_t field_id;
  Deserializer *in_stack_ffffffffffffff80;
  Deserializer *ret_00;
  field_id_t field_id_00;
  Deserializer *this_01;
  undefined1 local_18 [8];
  Deserializer *local_10;
  
  fVar4 = (field_id_t)((ulong)in_stack_ffffffffffffff48 >> 0x30);
  fVar5 = (field_id_t)((ulong)in_stack_ffffffffffffff78 >> 0x30);
  local_10 = in_RSI;
  operator_new(0x110);
  CopyInfo(in_stack_ffffffffffffff60);
  field_id_00 = (field_id_t)((ulong)local_18 >> 0x30);
  unique_ptr<duckdb::CopyInfo,std::default_delete<duckdb::CopyInfo>,true>::
  unique_ptr<std::default_delete<duckdb::CopyInfo>,void>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  this_01 = local_10;
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
            (in_stack_ffffffffffffff30);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (in_stack_ffffffffffffff80,fVar5,(char *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  ret_00 = local_10;
  pCVar1 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     (in_stack_ffffffffffffff30);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (in_stack_ffffffffffffff80,fVar5,(char *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
            (in_stack_ffffffffffffff30);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (in_stack_ffffffffffffff80,fVar5,(char *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  fVar5 = (field_id_t)((ulong)in_stack_ffffffffffffff68 >> 0x30);
  pDVar3 = local_10;
  this = (Deserializer *)
         unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                   (in_stack_ffffffffffffff30);
  field_id = (field_id_t)((ulong)pDVar3 >> 0x30);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (in_stack_ffffffffffffff70,fVar5,(char *)in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  ret = local_10;
  pCVar2 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     (in_stack_ffffffffffffff30);
  Deserializer::ReadPropertyWithDefault<bool>
            (in_stack_ffffffffffffff50,fVar4,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
            (in_stack_ffffffffffffff30);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (this,field_id,(char *)pCVar2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ret);
  pDVar3 = local_10;
  this_00 = (Deserializer *)
            unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                      (in_stack_ffffffffffffff30);
  fVar4 = (field_id_t)((ulong)pDVar3 >> 0x30);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (this,field_id,(char *)pCVar2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ret);
  pDVar3 = local_10;
  pCVar2 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     (in_stack_ffffffffffffff30);
  Deserializer::
  ReadPropertyWithDefault<std::unordered_map<std::__cxx11::string,duckdb::vector<duckdb::Value,true>,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::vector<duckdb::Value,true>>>>>
            (this_01,field_id_00,(char *)pCVar1,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>_>
              *)ret_00);
  pCVar1 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     (in_stack_ffffffffffffff30);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>
            (this_00,fVar4,(char *)pCVar2,
             (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)pDVar3);
  unique_ptr<duckdb::ParseInfo,std::default_delete<duckdb::ParseInfo>,true>::
  unique_ptr<duckdb::CopyInfo,std::default_delete<std::unique_ptr<duckdb::ParseInfo,std::default_delete<duckdb::ParseInfo>>>,void>
            ((unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *)pCVar1,
             (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_> *)local_10);
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::~unique_ptr
            ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)0xae1a93);
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (__uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>.
         super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ParseInfo> CopyInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<CopyInfo>(new CopyInfo());
	deserializer.ReadPropertyWithDefault<string>(200, "catalog", result->catalog);
	deserializer.ReadPropertyWithDefault<string>(201, "schema", result->schema);
	deserializer.ReadPropertyWithDefault<string>(202, "table", result->table);
	deserializer.ReadPropertyWithDefault<vector<string>>(203, "select_list", result->select_list);
	deserializer.ReadPropertyWithDefault<bool>(204, "is_from", result->is_from);
	deserializer.ReadPropertyWithDefault<string>(205, "format", result->format);
	deserializer.ReadPropertyWithDefault<string>(206, "file_path", result->file_path);
	deserializer.ReadPropertyWithDefault<case_insensitive_map_t<vector<Value>>>(207, "options", result->options);
	deserializer.ReadPropertyWithDefault<unique_ptr<QueryNode>>(208, "select_statement", result->select_statement);
	return std::move(result);
}